

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall asl::Log::Log(Log *this)

{
  Mutex *this_00;
  Log *this_local;
  
  Singleton<asl::Log>::Singleton((Singleton<asl::Log> *)this);
  asl::String::String(&this->_logfile);
  asl::String::operator=(&this->_logfile,"log.log");
  this->_useconsole = true;
  this->_usefile = true;
  this->_maxLevel = 2;
  this_00 = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this_00);
  this->_mutex = this_00;
  return;
}

Assistant:

Log::Log()
{
	_logfile = "log.log";
	_useconsole = true;
	_usefile = true;
	_maxLevel = 2;
	_mutex = new Mutex;
}